

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_13,_13>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  Type in1;
  Type in0;
  Vec4 *local_130;
  ulong local_128;
  float local_120 [6];
  float local_108 [4];
  float local_f8;
  undefined8 local_f4;
  undefined8 local_ec;
  undefined4 local_e4;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined8 local_d4;
  undefined4 local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  
  pfVar1 = res.m_data + 2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar7) = uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      pfVar1 = pfVar1 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar6 != 4);
    stack0xffffffffffffffb8 = *(undefined8 *)evalCtx->in[0].m_data;
  }
  else {
    stack0xffffffffffffffb8 = 0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat4x4;
    lVar3 = 0;
    do {
      lVar6 = 0;
      do {
        pfVar1[lVar6] = *(float *)((long)puVar4 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      lVar3 = lVar3 + 1;
      pfVar1 = pfVar1 + 1;
      puVar4 = puVar4 + 4;
    } while (lVar3 != 4);
  }
  puVar2 = &local_88;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar7) = uVar8;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar3 = lVar3 + 0x10;
    } while (lVar6 != 4);
    local_88 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_80 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    res_1.m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    stack0xffffffffffffff90 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    res.m_data._0_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    stack0xffffffffffffff90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    puVar4 = &DAT_00b1d5f0;
    lVar3 = 0;
    do {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)puVar2 + lVar6 * 4) = *(undefined4 *)((long)puVar4 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      lVar3 = lVar3 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar4 = puVar4 + 4;
    } while (lVar3 != 4);
  }
  puVar2 = &local_c8;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_b4 = 0;
  uStack_b0 = 0;
  uStack_ac = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  lVar3 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar3 != lVar7) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)puVar2 + lVar7) = uVar8;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    lVar6 = lVar6 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    lVar3 = lVar3 + 0x10;
  } while (lVar6 != 4);
  puVar2 = &local_c8;
  puVar5 = &local_88;
  pfVar1 = res.m_data + 2;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      *(float *)((long)puVar2 + lVar6) =
           *(float *)((long)pfVar1 + lVar6) * *(float *)((long)puVar5 + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x40);
    lVar3 = lVar3 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    puVar5 = (undefined8 *)((long)puVar5 + 4);
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 4);
  local_d4 = local_c8;
  local_cc = (undefined4)uStack_c0;
  local_e0 = CONCAT44(uStack_b0,uStack_b4);
  local_d8 = uStack_ac;
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  local_108[2] = 0.0;
  lVar3 = 0;
  do {
    local_108[lVar3] =
         *(float *)((long)&local_d4 + lVar3 * 4) + *(float *)((long)&local_e0 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_ec = uStack_a0;
  local_e4 = (undefined4)local_a8;
  local_130 = (Vec4 *)0x0;
  local_128 = local_128 & 0xffffffff00000000;
  lVar3 = 0;
  do {
    *(float *)((long)&local_130 + lVar3 * 4) =
         local_108[lVar3] + *(float *)((long)&local_ec + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_f8 = uStack_90._4_4_;
  local_f4 = local_98;
  local_120[2] = 0.0;
  local_120[3] = 0.0;
  local_120[4] = 0.0;
  lVar3 = 0;
  do {
    local_120[lVar3 + 2] = *(float *)((long)&local_130 + lVar3 * 4) + (&local_f8)[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_130 = &evalCtx->color;
  local_128 = 0x100000000;
  local_120[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_130 + lVar3 * 4)] = local_120[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}